

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinTlMode::~MthdKelvinTlMode(MthdKelvinTlMode *this)

{
  MthdKelvinTlMode *this_local;
  
  ~MthdKelvinTlMode(this);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		adjust_orig_bundle(&orig);
		if (rnd() & 1) {
			val &= 0x117;
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
	}